

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_cmdline.c
# Opt level: O0

int cmdline_add_arg(archive_cmdline *data,char *arg)

{
  void *pvVar1;
  char *pcVar2;
  int iVar3;
  char *in_RSI;
  long *in_RDI;
  char **newargv;
  int local_4;
  
  if (*in_RDI == 0) {
    local_4 = -0x19;
  }
  else {
    pvVar1 = realloc((void *)in_RDI[1],(long)((int)in_RDI[2] + 2) << 3);
    if (pvVar1 == (void *)0x0) {
      local_4 = -0x1e;
    }
    else {
      in_RDI[1] = (long)pvVar1;
      pcVar2 = strdup(in_RSI);
      *(char **)(in_RDI[1] + (long)(int)in_RDI[2] * 8) = pcVar2;
      if (*(long *)(in_RDI[1] + (long)(int)in_RDI[2] * 8) == 0) {
        local_4 = -0x1e;
      }
      else {
        iVar3 = (int)in_RDI[2] + 1;
        *(int *)(in_RDI + 2) = iVar3;
        *(undefined8 *)(in_RDI[1] + (long)iVar3 * 8) = 0;
        local_4 = 0;
      }
    }
  }
  return local_4;
}

Assistant:

static int
cmdline_add_arg(struct archive_cmdline *data, const char *arg)
{
	char **newargv;

	if (data->path == NULL)
		return (ARCHIVE_FAILED);

	newargv = realloc(data->argv, (data->argc + 2) * sizeof(char *));
	if (newargv == NULL)
		return (ARCHIVE_FATAL);
	data->argv = newargv;
	data->argv[data->argc] = strdup(arg);
	if (data->argv[data->argc] == NULL)
		return (ARCHIVE_FATAL);
	/* Set the terminator of argv. */
	data->argv[++data->argc] = NULL;
	return (ARCHIVE_OK);
}